

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OpenDDLParser.cpp
# Opt level: O1

char * ODDLParser::OpenDDLParser::parseIdentifier(char *in,char *end,Text **id)

{
  byte bVar1;
  Text *this;
  byte *pbVar2;
  byte *pbVar3;
  size_t sVar4;
  size_t sVar5;
  
  *id = (Text *)0x0;
  pbVar3 = (byte *)in;
  if (in != end && in != (char *)0x0) {
    do {
      in = (char *)pbVar3;
      if ((0x2c < (ulong)(byte)*in) || ((0x100100002600U >> ((ulong)(byte)*in & 0x3f) & 1) == 0))
      break;
      pbVar3 = (byte *)in + 1;
      in = end;
    } while (pbVar3 != (byte *)end);
    if (9 < (byte)(*in - 0x30U)) {
      sVar4 = 0;
      pbVar3 = (byte *)in;
      while( true ) {
        bVar1 = ((byte *)in)[sVar4];
        pbVar2 = pbVar3;
        sVar5 = sVar4;
        if ((((((ulong)bVar1 < 0x2d) && ((0x130100000200U >> ((ulong)bVar1 & 0x3f) & 1) != 0)) ||
             ((bVar1 - 0x5b < 0x23 && ((0x500000001U >> ((ulong)(bVar1 - 0x5b) & 0x3f) & 1) != 0))))
            || (pbVar2 = (byte *)end, sVar5 = (long)end - (long)in,
               (byte *)in + sVar4 == (byte *)end)) ||
           ((bVar1 < 0x2a &&
            (pbVar2 = (byte *)in + sVar4, sVar5 = sVar4,
            (0x31000002400U >> ((ulong)(uint)bVar1 & 0x3f) & 1) != 0)))) break;
        pbVar3 = pbVar3 + 1;
        sVar4 = sVar4 + 1;
      }
      this = (Text *)operator_new(0x18);
      Text::Text(this,in,sVar5);
      *id = this;
      in = (char *)pbVar2;
    }
  }
  return (char *)(byte *)in;
}

Assistant:

char *OpenDDLParser::parseIdentifier( char *in, char *end, Text **id ) {
    *id = ddl_nullptr;
    if( ddl_nullptr == in || in == end ) {
        return in;
    }

    // ignore blanks
    in = lookForNextToken( in, end );

    // staring with a number is forbidden
    if( isNumeric<const char>( *in ) ) {
        return in;
    }

    // get size of id
    size_t idLen( 0 );
    char *start( in );
    while( !isSeparator( *in ) && 
            !isNewLine( *in ) && ( in != end ) && 
            *in != Grammar::OpenPropertyToken[ 0 ] &&
            *in != Grammar::ClosePropertyToken[ 0 ] && 
            *in != '$' ) {
        ++in;
        ++idLen;
    }

    const size_t len( idLen );
    *id = new Text( start, len );

    return in;
}